

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

void mxx::attr_map<int,_std::function<void_(void_*,_void_*,_int_*)>_>::set
               (MPI_Datatype *dt,int *k,function<void_(void_*,_void_*,_int_*)> *value)

{
  MPI_Datatype poVar1;
  bool bVar2;
  mutex *__m;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *pmVar3;
  function<void_(void_*,_void_*,_int_*)> *this;
  mapped_type *pmVar4;
  function<void_(void_*,_void_*,_int_*)> *val;
  _Self local_30;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock;
  function<void_(void_*,_void_*,_int_*)> *value_local;
  int *k_local;
  MPI_Datatype *dt_local;
  
  lock._M_device = (mutex_type *)value;
  __m = mut();
  std::lock_guard<std::mutex>::lock_guard(&local_28,__m);
  pmVar3 = keymap();
  local_30._M_node =
       (_Base_ptr)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::find
                 (pmVar3,k);
  pmVar3 = keymap();
  val = (function<void_(void_*,_void_*,_int_*)> *)
        std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end(pmVar3)
  ;
  bVar2 = std::operator==(&local_30,(_Self *)&val);
  if (bVar2) {
    pmVar3 = keymap();
    pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](pmVar3,k);
    *pmVar4 = 0;
    pmVar3 = keymap();
    pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](pmVar3,k);
    MPI_Type_create_keyval(copy_attr,del_attr,pmVar4,0);
  }
  this = (function<void_(void_*,_void_*,_int_*)> *)operator_new(0x20);
  std::function<void_(void_*,_void_*,_int_*)>::function
            (this,(function<void_(void_*,_void_*,_int_*)> *)lock._M_device);
  poVar1 = *dt;
  pmVar3 = keymap();
  pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[](pmVar3,k);
  MPI_Type_set_attr(poVar1,*pmVar4,this);
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return;
}

Assistant:

static void set(const MPI_Datatype& dt, const K& k, const T& value) {
        std::lock_guard<std::mutex> lock(mut());
        if (keymap().find(k) == keymap().end()) {
            // create new keyval with MPI
            keymap()[k] = 0;
            MPI_Type_create_keyval(&attr_map<K,T>::copy_attr,
                                   &attr_map<K,T>::del_attr,
                                   &(keymap()[k]), (void*)NULL);
        }
        // insert new key into keymap
        // set the keyval pair
        T* val = new T(value); // copy construct
        MPI_Type_set_attr(dt, keymap()[k], (void*)val);
    }